

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O2

int __thiscall simple_thread_pool::ThreadHandle::shutdown(ThreadHandle *this,int __fd,int __how)

{
  element_type *peVar1;
  int extraout_EAX;
  
  EventAwaiter::invoke(&this->eaLoop);
  peVar1 = (this->tHandle).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) && ((peVar1->_M_id)._M_thread != 0)) {
    std::thread::join();
  }
  std::__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->myself).
              super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->tHandle).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->assignedTask).
              super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>);
  return extraout_EAX;
}

Assistant:

void shutdown() {
        eaLoop.invoke();
        if (tHandle && tHandle->joinable()) {
            tHandle->join();
        }
        myself.reset();
        tHandle.reset();
        assignedTask.reset();
    }